

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::rescale_variable_scores(Internal *this)

{
  int iVar1;
  pointer pdVar2;
  int idx;
  long count;
  int iVar3;
  double dVar4;
  double dVar5;
  
  count = (this->stats).rescored + 1;
  (this->stats).rescored = count;
  iVar1 = *(this->vars).n;
  pdVar2 = (this->stab).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = this->score_inc;
  for (iVar3 = 1; iVar3 - iVar1 != 1; iVar3 = iVar3 + 1) {
    dVar4 = pdVar2[iVar3];
    if (pdVar2[iVar3] <= dVar5) {
      dVar4 = dVar5;
    }
    dVar5 = dVar4;
  }
  if (this->internal != (Internal *)0x0) {
    phase(this->internal,"rescore",count,"rescoring %d variable scores by 1/%g",dVar5,
          (ulong)(uint)this->max_var);
    iVar1 = *(this->vars).n;
    pdVar2 = (this->stab).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  for (iVar3 = 1; iVar1 + 1 != iVar3; iVar3 = iVar3 + 1) {
    pdVar2[iVar3] = pdVar2[iVar3] * (1.0 / dVar5);
  }
  this->score_inc = (1.0 / dVar5) * this->score_inc;
  if (this->internal != (Internal *)0x0) {
    phase(this->internal,"rescore",(this->stats).rescored,
          "new score increment %g after %ld conflicts",(this->stats).conflicts);
    return;
  }
  return;
}

Assistant:

void Internal::rescale_variable_scores () {
  stats.rescored++;
  double divider = score_inc;
  for (auto idx : vars) {
    const double tmp = stab[idx];
    if (tmp > divider)
      divider = tmp;
  }
  PHASE ("rescore", stats.rescored, "rescoring %d variable scores by 1/%g",
         max_var, divider);
  assert (divider > 0);
  double factor = 1.0 / divider;
  for (auto idx : vars)
    stab[idx] *= factor;
  score_inc *= factor;
  PHASE ("rescore", stats.rescored,
         "new score increment %g after %" PRId64 " conflicts", score_inc,
         stats.conflicts);
}